

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string.h
# Opt level: O0

string * peparse::to_string<unsigned_int>(uint t,_func_ios_base_ptr_ios_base_ptr *f)

{
  ostream *this;
  _func_ios_base_ptr_ios_base_ptr *in_RDX;
  uint in_ESI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_190 [376];
  _func_ios_base_ptr_ios_base_ptr *local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  this = (ostream *)std::ostream::operator<<((ostream *)local_190,local_18);
  std::ostream::operator<<(this,local_c);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string to_string(T t, std::ios_base &(*f)(std::ios_base &) ) {
  std::ostringstream oss;
  oss << f << t;
  return oss.str();
}